

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::ShellCommand::processDependencyInfoDiscoveredDependencies
          (ShellCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          StringRef depsPath,MemoryBuffer *input)

{
  StringRef data;
  DependencyInfoParser local_b0;
  char *local_98;
  size_t local_90;
  void *local_88;
  void *local_80;
  undefined1 local_78 [8];
  DepsActions actions;
  MemoryBuffer *input_local;
  QueueJobContext *context_local;
  BuildSystem *system_local;
  ShellCommand *this_local;
  TaskInterface ti_local;
  
  local_80 = ti.ctx;
  local_88 = ti.impl;
  local_98 = depsPath.Data;
  local_90 = depsPath.Length;
  actions._56_8_ = input;
  processDependencyInfoDiscoveredDependencies(llbuild::buildsystem::BuildSystem&,llbuild::core::
  TaskInterface,llbuild::basic::QueueJobContext*,llvm::StringRef,llvm::MemoryBuffer*)::DepsActions::
  DepsActions(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::buildsystem::
  ShellCommand*,llvm::StringRef_(local_78,system,ti,this,depsPath);
  data = llvm::MemoryBuffer::getBuffer((MemoryBuffer *)actions._56_8_);
  core::DependencyInfoParser::DependencyInfoParser(&local_b0,data,(ParseActions *)local_78);
  core::DependencyInfoParser::parse(&local_b0);
  processDependencyInfoDiscoveredDependencies::DepsActions::~DepsActions((DepsActions *)local_78);
  return (int)actions.depsPath.Length == 0;
}

Assistant:

bool
ShellCommand::processDependencyInfoDiscoveredDependencies(BuildSystem& system,
                                                          TaskInterface ti,
                                                          QueueJobContext* context,
                                                          StringRef depsPath,
                                                          llvm::MemoryBuffer* input) {
  // Parse the output.
  //
  // We just ignore the rule, and add any dependency that we encounter in the
  // file.
  struct DepsActions : public core::DependencyInfoParser::ParseActions {
    BuildSystem& system;
    TaskInterface ti;
    ShellCommand* command;
    StringRef depsPath;
    unsigned numErrors{0};

    DepsActions(BuildSystem& system, TaskInterface ti,
                ShellCommand* command, StringRef depsPath)
        : system(system), ti(ti), command(command), depsPath(depsPath) {}

    virtual void error(const char* message, uint64_t position) override {
      system.getDelegate().commandHadError(
          command, ("error reading dependency file '" + depsPath.str() +
                    "': " + std::string(message)));
      ++numErrors;
    }

    // Ignore everything but actual inputs.
    virtual void actOnVersion(StringRef) override { }
    virtual void actOnMissing(StringRef path) override {
      system.getDelegate().commandFoundDiscoveredDependency(command, path, DiscoveredDependencyKind::Missing);
    }
    virtual void actOnOutput(StringRef path) override {
      system.getDelegate().commandFoundDiscoveredDependency(command, path, DiscoveredDependencyKind::Output);
    }
    virtual void actOnInput(StringRef path) override {
      ti.discoveredDependency(BuildKey::makeNode(path).toData());
      system.getDelegate().commandFoundDiscoveredDependency(command, path, DiscoveredDependencyKind::Input);
    }
  };

  DepsActions actions(system, ti, this, depsPath);
  core::DependencyInfoParser(input->getBuffer(), actions).parse();
  return actions.numErrors == 0;
}